

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tuple.c
# Opt level: O0

sysbvm_tuple_t
sysbvm_tuple_primitive_new
          (sysbvm_context_t *context,sysbvm_tuple_t closure,size_t argumentCount,
          sysbvm_tuple_t *arguments)

{
  size_t slotCount;
  sysbvm_object_tuple_t *psVar1;
  sysbvm_tuple_t *arguments_local;
  size_t argumentCount_local;
  sysbvm_tuple_t closure_local;
  sysbvm_context_t *context_local;
  
  if (argumentCount != 1) {
    sysbvm_error_argumentCountMismatch(1,argumentCount);
  }
  slotCount = sysbvm_tuple_anySize_decode(*arguments);
  psVar1 = sysbvm_context_allocatePointerTuple(context,0,slotCount);
  return (sysbvm_tuple_t)psVar1;
}

Assistant:

static sysbvm_tuple_t sysbvm_tuple_primitive_new(sysbvm_context_t *context, sysbvm_tuple_t closure, size_t argumentCount, sysbvm_tuple_t *arguments)
{
    (void)context;
    (void)closure;
    if(argumentCount != 1) sysbvm_error_argumentCountMismatch(1, argumentCount);

    return (sysbvm_tuple_t)sysbvm_context_allocatePointerTuple(context, SYSBVM_NULL_TUPLE, sysbvm_tuple_anySize_decode(arguments[0]));
}